

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderCreateShaderProgramvTest::iterate(GeometryShaderCreateShaderProgramvTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_8a0;
  uint local_71c;
  char *pcStack_718;
  uint x;
  uchar *traveller_ptr;
  char local_708 [4];
  uint y;
  uchar result_data [64];
  uint local_544;
  undefined1 local_540 [4];
  uint n_po_id;
  MessageBuilder local_3c0;
  MessageBuilder local_240;
  int local_bc;
  undefined8 uStack_b8;
  GLint link_status;
  char *vs_specialized_code_raw;
  string vs_specialized_code;
  char *gs_specialized_code_raw;
  string gs_specialized_code;
  char *fs_specialized_code_raw;
  string fs_specialized_code;
  GLuint local_2c [2];
  GLuint so_po_ids [3];
  bool result;
  uint n_so_po_ids;
  Functions *gl;
  GeometryShaderCreateShaderProgramvTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  so_po_ids[2] = 3;
  so_po_ids[1]._3_1_ = 1;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x109);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initFBO(this);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&fs_specialized_code_raw,&this->super_TestCaseBase,1,&fs_code);
  gs_specialized_code.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&gs_specialized_code_raw,&this->super_TestCaseBase,1,&gs_code);
  vs_specialized_code.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&vs_specialized_code_raw,&this->super_TestCaseBase,1,&vs_code);
  uStack_b8 = std::__cxx11::string::c_str();
  local_bc = 1;
  GVar2 = (**(code **)(lVar5 + 0x3f8))(0x8dd9,1,&gs_code);
  this->m_gs_po_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShaderProgramv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x120);
  if (this->m_gs_po_id == 0) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_240,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [42])0x2af6ef2);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_240);
    so_po_ids[1]._3_1_ = 0;
  }
  else {
    (**(code **)(lVar5 + 0x9d8))(this->m_gs_po_id,0x8b82,&local_bc);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,300);
    if (local_bc == 0) {
      (**(code **)(lVar5 + 0x448))(this->m_gs_po_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glDeleteProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x138);
      GVar2 = (**(code **)(lVar5 + 0x3f8))
                        (0x8b30,1,(undefined1 *)((long)&gs_specialized_code.field_2 + 8));
      this->m_fs_po_id = GVar2;
      GVar2 = (**(code **)(lVar5 + 0x3f8))
                        (0x8dd9,1,(undefined1 *)((long)&vs_specialized_code.field_2 + 8));
      this->m_gs_po_id = GVar2;
      GVar2 = (**(code **)(lVar5 + 0x3f8))(0x8b31,1,&stack0xffffffffffffff48);
      this->m_vs_po_id = GVar2;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glCreateShaderProgramv() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x142);
      if (((this->m_fs_po_id == 0) || (this->m_gs_po_id == 0)) || (this->m_vs_po_id == 0)) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_540,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_540,
                            (char (*) [55])"At least one glCreateShaderProgramv() call returned 0.")
        ;
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_540);
        so_po_ids[1]._3_1_ = 0;
      }
      else {
        local_2c[0] = this->m_fs_po_id;
        local_2c[1] = this->m_gs_po_id;
        so_po_ids[0] = this->m_vs_po_id;
        for (local_544 = 0; local_544 != 3; local_544 = local_544 + 1) {
          (**(code **)(lVar5 + 0x9d8))(local_2c[local_544],0x8b82,&local_bc);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glGetProgramiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x155);
          if (local_bc != 1) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)(result_data + 0x38),pTVar6,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)(result_data + 0x38),
                                (char (*) [33])"A valid shader program with id [");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_2c + local_544);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [31])"] was not linked successfully.");
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(result_data + 0x38));
            so_po_ids[1]._3_1_ = 0;
            goto LAB_0158b271;
          }
        }
        (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x163);
        (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x166);
        initPipelineObject(this);
        (**(code **)(lVar5 + 0x98))(this->m_pipeline_object_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glBindProgramPipeline() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x16d);
        (**(code **)(lVar5 + 0x538))(0,0,1);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glDrawArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x171);
        (**(code **)(lVar5 + 0x1220))(0,0,4,4,0x1908,0x1401,local_708);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glReadPixels() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x179);
        for (traveller_ptr._4_4_ = 0; traveller_ptr._4_4_ < 4;
            traveller_ptr._4_4_ = traveller_ptr._4_4_ + 1) {
          pcStack_718 = local_708 + (traveller_ptr._4_4_ << 2);
          for (local_71c = 0; local_71c < 4; local_71c = local_71c + 1) {
            if (((*pcStack_718 != '\0') || (pcStack_718[1] != -1)) ||
               ((pcStack_718[2] != '\0' || (pcStack_718[3] != '\0')))) {
              pTVar6 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_8a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_8a0,(char (*) [32])"Invalid result texel found at (");
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_71c);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&traveller_ptr + 4));
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_8a0);
              so_po_ids[1]._3_1_ = 0;
            }
            pcStack_718 = pcStack_718 + 4;
          }
        }
      }
    }
    else {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3c0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_3c0,
                          (char (*) [51])"An invalid shader program was linked successfully.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3c0);
      so_po_ids[1]._3_1_ = 0;
    }
  }
LAB_0158b271:
  if ((so_po_ids[1]._3_1_ & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::__cxx11::string::~string((string *)&vs_specialized_code_raw);
  std::__cxx11::string::~string((string *)&gs_specialized_code_raw);
  std::__cxx11::string::~string((string *)&fs_specialized_code_raw);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderCreateShaderProgramvTest::iterate()
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	const unsigned int	n_so_po_ids = 3;
	bool				  result	  = true;
	glw::GLuint			  so_po_ids[n_so_po_ids];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize off-screen rendering */
	initFBO();

	/* Form shader sources */
	std::string fs_specialized_code = specializeShader(1,
													   /* parts */ &fs_code);
	const char* fs_specialized_code_raw = fs_specialized_code.c_str();
	std::string gs_specialized_code		= specializeShader(1,
													   /* parts */ &gs_code);
	const char* gs_specialized_code_raw = gs_specialized_code.c_str();
	std::string vs_specialized_code		= specializeShader(1,
													   /* parts */ &vs_code);
	const char* vs_specialized_code_raw = vs_specialized_code.c_str();

	/* Try to create an invalid geometry shader program first */
	glw::GLint link_status = GL_TRUE;

	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &gs_code);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

	if (m_gs_po_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glCreateShaderProgramv() call returned 0."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.getProgramiv(m_gs_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_FALSE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "An invalid shader program was linked successfully."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.deleteProgram(m_gs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed.");

	/* Create shader programs */
	m_fs_po_id = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, /* count */
										 &fs_specialized_code_raw);
	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &gs_specialized_code_raw);
	m_vs_po_id = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, /* count */
										 &vs_specialized_code_raw);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call(s) failed.");

	if (m_fs_po_id == 0 || m_gs_po_id == 0 || m_vs_po_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "At least one glCreateShaderProgramv() call returned 0."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Make sure all shader programs were linked successfully */
	so_po_ids[0] = m_fs_po_id;
	so_po_ids[1] = m_gs_po_id;
	so_po_ids[2] = m_vs_po_id;

	for (unsigned int n_po_id = 0; n_po_id != n_so_po_ids; ++n_po_id)
	{
		gl.getProgramiv(so_po_ids[n_po_id], GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A valid shader program with id [" << so_po_ids[n_po_id]
							   << "] was not linked successfully." << tcu::TestLog::EndMessage;

			result = false;
			goto end;
		}
	}

	/* Set up the vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up the pipeline object */
	initPipelineObject();

	/* Render a full-screen quad */
	gl.bindProgramPipeline(m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	gl.drawArrays(GL_POINTS, 0, /* first */
				  1);			/* count */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

	/* Verify the rendering result */
	unsigned char result_data[m_to_width * m_to_height * 4 /* rgba */];

	gl.readPixels(0, /* x */
				  0, /* y */
				  m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		unsigned char* traveller_ptr = result_data + 4 * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			if (traveller_ptr[0] != 0 || traveller_ptr[1] != 255 || traveller_ptr[2] != 0 || traveller_ptr[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid result texel found at (" << x << ", " << y
								   << ")." << tcu::TestLog::EndMessage;

				result = false;
			}

			traveller_ptr += 4; /* rgba */
		}
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}